

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::exception::exception(exception *this,size_t line,string *file,string *code,string *what)

{
  string sStack_48;
  
  *(undefined ***)this = &PTR__exception_0023afc0;
  this->mLine = line;
  std::__cxx11::string::string((string *)&this->mFile,(string *)file);
  std::__cxx11::string::string((string *)&this->mCode,(string *)code);
  std::__cxx11::string::string((string *)&this->mWhat,(string *)what);
  (this->mStr)._M_dataplus._M_p = (pointer)&(this->mStr).field_2;
  (this->mStr)._M_string_length = 0;
  (this->mStr).field_2._M_local_buf[0] = '\0';
  compose_what(&sStack_48,&this->mFile,this->mLine,&this->mCode,&this->mWhat);
  std::__cxx11::string::operator=((string *)&this->mStr,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

exception(std::size_t line, std::string file, std::string code, std::string what) noexcept:
			mLine(line), mFile(std::move(file)), mCode(std::move(code)), mWhat(std::move(what))
		{
			mStr = compose_what(mFile, mLine, mCode, mWhat);
		}